

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O3

vector3df * __thiscall irr::scene::SSkinMeshBuffer::getPosition(SSkinMeshBuffer *this,u32 i)

{
  ulong uVar1;
  
  uVar1 = (ulong)i;
  if (this->VertexType == EVT_TANGENTS) {
    return (vector3df *)(uVar1 * 0x3c + *(long *)&(this->super_IMeshBuffer).field_0x8);
  }
  if (this->VertexType == EVT_2TCOORDS) {
    return (vector3df *)
           ((this->Vertices_2TCoords).m_data.
            super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
            ._M_impl.super__Vector_impl_data._M_start + uVar1);
  }
  return &(this->Vertices_Standard).m_data.
          super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1].Pos;
}

Assistant:

const core::vector3df &getPosition(u32 i) const override
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return Vertices_2TCoords[i].Pos;
		case video::EVT_TANGENTS:
			return Vertices_Tangents[i].Pos;
		default:
			return Vertices_Standard[i].Pos;
		}
	}